

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doit.cpp
# Opt level: O1

bool getdamagebindictionary
               (vector<damagebindictionary,_std::allocator<damagebindictionary>_>
                *damagebindictionary_vec_)

{
  pointer *ppdVar1;
  pointer pdVar2;
  iterator __position;
  iterator __position_00;
  OASIS_FLOAT OVar3;
  OASIS_FLOAT OVar4;
  OASIS_FLOAT OVar5;
  int iVar6;
  FILE *pFVar7;
  ulong uVar8;
  size_t sVar9;
  vector<item_map_rec,std::allocator<item_map_rec>> *this;
  undefined8 extraout_RAX;
  char *this_00;
  char *this_01;
  char *__ptr;
  ulong unaff_R12;
  damagebindictionary *__args;
  long lVar10;
  ulong unaff_R13;
  FILE *unaff_R14;
  damagebindictionary *unaff_R15;
  undefined8 uStack_a8;
  damagebindictionary *pdStack_a0;
  ulong uStack_98;
  FILE *pFStack_90;
  damagebindictionary *pdStack_88;
  item_map_rec iStack_78;
  key_type kStack_6c;
  undefined1 auStack_64 [16];
  int iStack_54;
  vector<damagebindictionary,_std::allocator<damagebindictionary>_> *pvStack_50;
  ulong uStack_48;
  ulong uStack_40;
  FILE *pFStack_38;
  damagebindictionary *pdStack_30;
  
  this_00 = "static/damage_bin_dict.bin";
  pdStack_30 = (damagebindictionary *)0x10875b;
  pFVar7 = fopen("static/damage_bin_dict.bin","rb");
  if (pFVar7 == (FILE *)0x0) {
    pdStack_30 = (damagebindictionary *)0x108841;
    getdamagebindictionary();
  }
  else {
    pdStack_30 = (damagebindictionary *)0x108776;
    fseek(pFVar7,0,2);
    pdStack_30 = (damagebindictionary *)0x10877e;
    uVar8 = ftell(pFVar7);
    pdStack_30 = (damagebindictionary *)0x10878d;
    fseek(pFVar7,0,0);
    unaff_R12 = uVar8 / 0x14;
    unaff_R13 = unaff_R12 & 0xffffffff;
    pdStack_30 = (damagebindictionary *)0x1087b8;
    unaff_R15 = (damagebindictionary *)operator_new__(unaff_R13 * 0x14);
    pdStack_30 = (damagebindictionary *)0x1087ce;
    this_00 = (char *)unaff_R15;
    sVar9 = fread(unaff_R15,0x14,unaff_R13,pFVar7);
    unaff_R14 = pFVar7;
    if (sVar9 == unaff_R13) {
      pdVar2 = (damagebindictionary_vec_->
               super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>).
               _M_impl.super__Vector_impl_data._M_start;
      if ((damagebindictionary_vec_->
          super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>)._M_impl.
          super__Vector_impl_data._M_finish != pdVar2) {
        (damagebindictionary_vec_->
        super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>)._M_impl.
        super__Vector_impl_data._M_finish = pdVar2;
      }
      if ((int)unaff_R12 != 0) {
        uVar8 = unaff_R12 & 0xffffffff;
        __args = unaff_R15;
        do {
          __position._M_current =
               (damagebindictionary_vec_->
               super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>).
               _M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (damagebindictionary_vec_->
              super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>)._M_impl
              .super__Vector_impl_data._M_end_of_storage) {
            pdStack_30 = (damagebindictionary *)0x108817;
            std::vector<damagebindictionary,std::allocator<damagebindictionary>>::
            _M_realloc_insert<damagebindictionary_const&>
                      ((vector<damagebindictionary,std::allocator<damagebindictionary>> *)
                       damagebindictionary_vec_,__position,__args);
          }
          else {
            (__position._M_current)->interval_type = __args->interval_type;
            OVar3 = __args->bin_from;
            OVar4 = __args->bin_to;
            OVar5 = __args->interpolation;
            (__position._M_current)->bin_index = __args->bin_index;
            (__position._M_current)->bin_from = OVar3;
            (__position._M_current)->bin_to = OVar4;
            (__position._M_current)->interpolation = OVar5;
            ppdVar1 = &(damagebindictionary_vec_->
                       super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            *ppdVar1 = *ppdVar1 + 1;
          }
          __args = __args + 1;
          uVar8 = uVar8 - 1;
        } while (uVar8 != 0);
      }
      pdStack_30 = (damagebindictionary *)0x108828;
      operator_delete__(unaff_R15);
      pdStack_30 = (damagebindictionary *)0x108830;
      fclose(pFVar7);
      return true;
    }
  }
  pdStack_30 = (damagebindictionary *)getitems;
  getdamagebindictionary();
  this_01 = "input/items.bin";
  pdStack_88 = (damagebindictionary *)0x108869;
  pvStack_50 = damagebindictionary_vec_;
  uStack_48 = unaff_R12;
  uStack_40 = unaff_R13;
  pFStack_38 = unaff_R14;
  pdStack_30 = unaff_R15;
  pFVar7 = fopen("input/items.bin","rb");
  if (pFVar7 != (FILE *)0x0) {
    pdStack_88 = (damagebindictionary *)0x108884;
    fseek(pFVar7,0,2);
    pdStack_88 = (damagebindictionary *)0x108890;
    fseek(pFVar7,0,0);
    pdStack_88 = (damagebindictionary *)0x108898;
    std::
    _Rb_tree<item_map_key,_std::pair<const_item_map_key,_std::vector<item_map_rec,_std::allocator<item_map_rec>_>_>,_std::_Select1st<std::pair<const_item_map_key,_std::vector<item_map_rec,_std::allocator<item_map_rec>_>_>_>,_std::less<item_map_key>,_std::allocator<std::pair<const_item_map_key,_std::vector<item_map_rec,_std::allocator<item_map_rec>_>_>_>_>
    ::clear((_Rb_tree<item_map_key,_std::pair<const_item_map_key,_std::vector<item_map_rec,_std::allocator<item_map_rec>_>_>,_std::_Select1st<std::pair<const_item_map_key,_std::vector<item_map_rec,_std::allocator<item_map_rec>_>_>_>,_std::less<item_map_key>,_std::allocator<std::pair<const_item_map_key,_std::vector<item_map_rec,_std::allocator<item_map_rec>_>_>_>_>
             *)this_00);
    pdStack_88 = (damagebindictionary *)0x1088af;
    sVar9 = fread(auStack_64,0x14,1,pFVar7);
    if (sVar9 != 0) {
      do {
        kStack_6c.areaperil_id = auStack_64._8_4_;
        kStack_6c.vulnerability_id = auStack_64._12_4_;
        iStack_78.item_id = auStack_64._0_4_;
        iStack_78.coverage_id = auStack_64._4_4_;
        iStack_78.group_id = iStack_54;
        pdStack_88 = (damagebindictionary *)0x1088ea;
        this = (vector<item_map_rec,std::allocator<item_map_rec>> *)
               std::
               map<item_map_key,_std::vector<item_map_rec,_std::allocator<item_map_rec>_>,_std::less<item_map_key>,_std::allocator<std::pair<const_item_map_key,_std::vector<item_map_rec,_std::allocator<item_map_rec>_>_>_>_>
               ::operator[]((map<item_map_key,_std::vector<item_map_rec,_std::allocator<item_map_rec>_>,_std::less<item_map_key>,_std::allocator<std::pair<const_item_map_key,_std::vector<item_map_rec,_std::allocator<item_map_rec>_>_>_>_>
                             *)this_00,&kStack_6c);
        __position_00._M_current = *(item_map_rec **)(this + 8);
        if (__position_00._M_current == *(item_map_rec **)(this + 0x10)) {
          pdStack_88 = (damagebindictionary *)0x108915;
          std::vector<item_map_rec,std::allocator<item_map_rec>>::
          _M_realloc_insert<item_map_rec_const&>(this,__position_00,&iStack_78);
        }
        else {
          (__position_00._M_current)->group_id = iStack_78.group_id;
          (__position_00._M_current)->item_id = iStack_78.item_id;
          (__position_00._M_current)->coverage_id = iStack_78.coverage_id;
          *(long *)(this + 8) = *(long *)(this + 8) + 0xc;
        }
        pdStack_88 = (damagebindictionary *)0x10892a;
        sVar9 = fread(auStack_64,0x14,1,pFVar7);
      } while (sVar9 != 0);
    }
    pdStack_88 = (damagebindictionary *)0x108937;
    fclose(pFVar7);
    return true;
  }
  pdStack_88 = (damagebindictionary *)getcoverages;
  getitems();
  __ptr = "input/coverages.bin";
  iVar6 = 0x10a1be;
  uStack_a8 = extraout_RAX;
  pdStack_a0 = (damagebindictionary *)this_00;
  uStack_98 = unaff_R12;
  pFStack_90 = unaff_R14;
  pdStack_88 = unaff_R15;
  pFVar7 = fopen("input/coverages.bin","rb");
  if (pFVar7 != (FILE *)0x0) {
    fseek(pFVar7,0,2);
    uVar8 = ftell(pFVar7);
    fseek(pFVar7,0,0);
    std::vector<float,_std::allocator<float>_>::resize
              ((vector<float,_std::allocator<float>_> *)this_01,(ulong)((int)(uVar8 >> 2) + 1));
    lVar10 = 4;
    sVar9 = fread((void *)((long)&uStack_a8 + 4),4,1,pFVar7);
    if (sVar9 != 0) {
      do {
        *(undefined4 *)
         ((long)(((vector<float,_std::allocator<float>_> *)this_01)->
                super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
                _M_start + lVar10) = uStack_a8._4_4_;
        sVar9 = fread((void *)((long)&uStack_a8 + 4),4,1,pFVar7);
        lVar10 = lVar10 + 4;
      } while (sVar9 != 0);
    }
    iVar6 = fclose(pFVar7);
    return SUB41(iVar6,0);
  }
  getcoverages();
  sVar9 = fread(__ptr,1,(long)iVar6,_stdin);
  return sVar9 == (long)iVar6;
}

Assistant:

bool getdamagebindictionary(std::vector<damagebindictionary> &damagebindictionary_vec_)
{

	FILE *fin = fopen(DAMAGE_BIN_DICT_FILE, "rb");
	if (fin == NULL) {
		fprintf(stderr, "FATAL: %s: cannot open %s\n", __func__, DAMAGE_BIN_DICT_FILE);
		exit(-1);
	}

	flseek(fin, 0L, SEEK_END);
	long long sz = fltell(fin);

	flseek(fin, 0L, SEEK_SET);
	unsigned int nrec = static_cast<unsigned int>(sz / sizeof(damagebindictionary));
	damagebindictionary *s1 = new damagebindictionary[nrec];
	if (fread(s1, sizeof(damagebindictionary), nrec, fin) != nrec) {
		fprintf(stderr, "FATAL: %s: Error reading file %s\n", __func__, DAMAGE_BIN_DICT_FILE);
		exit(-1);
	}
	damagebindictionary_vec_.clear();

	for (unsigned int i = 0; i < nrec; i++) {
		damagebindictionary_vec_.push_back(s1[i]);
	}
	delete[] s1;

	fclose(fin);
	return true;
}